

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall duckdb::ClientContext::~ClientContext(ClientContext *this)

{
  bool bVar1;
  
  bVar1 = Exception::UncaughtException();
  if (!bVar1) {
    Destroy(this);
  }
  ::std::unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>::
  ~unique_ptr(&(this->active_query).
               super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
             );
  TransactionContext::~TransactionContext(&this->transaction);
  ::std::unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>::~unique_ptr
            (&(this->client_data).
              super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>);
  ClientConfig::~ClientConfig(&this->config);
  ::std::unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>::~unique_ptr
            (&(this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)
  ;
  ::std::
  unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>::
  ~unique_ptr(&(this->registered_state).
               super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
             );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->db).internal.
              super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ClientContext::~ClientContext() {
	if (Exception::UncaughtException()) {
		return;
	}
	// destroy the client context and rollback if there is an active transaction
	// but only if we are not destroying this client context as part of an exception stack unwind
	Destroy();
}